

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_hook_test.cc
# Opt level: O0

void __thiscall
HookListTest_InvalidAddRejected_Test::~HookListTest_InvalidAddRejected_Test
          (HookListTest_InvalidAddRejected_Test *this)

{
  HookListTest_InvalidAddRejected_Test *this_local;
  
  ~HookListTest_InvalidAddRejected_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HookListTest, InvalidAddRejected) {
  TestHookList list{kTestValue};
  EXPECT_FALSE(list.Add(nullptr));

  MallocHook::NewHook values[2] = {};
  EXPECT_EQ(1, list.Traverse(values, 2));
  EXPECT_EQ(kTestValue, values[0]);
  EXPECT_EQ(1, list.priv_end);
}